

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_type.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalCreateType::GetData
          (PhysicalCreateType *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ClientContext *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  pointer pGVar5;
  pointer pCVar6;
  Catalog *this_00;
  type info;
  LogicalType local_30;
  
  iVar4 = (*(this->super_PhysicalOperator)._vptr_PhysicalOperator[0x21])();
  if ((char)iVar4 != '\0') {
    pGVar5 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(this->super_PhysicalOperator).sink_state);
    LogicalType::ENUM(&local_30,(Vector *)(pGVar5 + 1),
                      pGVar5[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                      __align);
    pCVar6 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
             operator->(&this->info);
    (pCVar6->type).id_ = local_30.id_;
    (pCVar6->type).physical_type_ = local_30.physical_type_;
    peVar2 = (pCVar6->type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (pCVar6->type).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (pCVar6->type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_30.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (pCVar6->type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_30.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_30.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    local_30.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
    ;
    LogicalType::~LogicalType(&local_30);
  }
  pCVar1 = context->client;
  pCVar6 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
           operator->(&this->info);
  this_00 = Catalog::GetCatalog(pCVar1,&(pCVar6->super_CreateInfo).catalog);
  pCVar1 = context->client;
  info = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
         operator*(&this->info);
  Catalog::CreateType(this_00,pCVar1,info);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalCreateType::GetData(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSourceInput &input) const {
	if (IsSink()) {
		D_ASSERT(info->type == LogicalType::INVALID);
		auto &g_sink_state = sink_state->Cast<CreateTypeGlobalState>();
		info->type = LogicalType::ENUM(g_sink_state.result, g_sink_state.size);
	}

	auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
	catalog.CreateType(context.client, *info);
	return SourceResultType::FINISHED;
}